

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_log_m(REF_DBL *m_upper_tri,REF_DBL *log_m_upper_tri)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL d [12];
  REF_DBL *log_m_upper_tri_local;
  REF_DBL *m_upper_tri_local;
  
  m_upper_tri_local._4_4_ = ref_matrix_diag_m(m_upper_tri,(REF_DBL *)&ref_private_macro_code_rss_1);
  if (m_upper_tri_local._4_4_ == 0) {
    _ref_private_macro_code_rss_1 = log(_ref_private_macro_code_rss_1);
    d[0] = log(d[0]);
    d[1] = log(d[1]);
    m_upper_tri_local._4_4_ =
         ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss_1,log_m_upper_tri);
    if (m_upper_tri_local._4_4_ == 0) {
      m_upper_tri_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x1fb,"ref_matrix_log_m",(ulong)m_upper_tri_local._4_4_,"form m");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x1f5,
           "ref_matrix_log_m",(ulong)m_upper_tri_local._4_4_,"diag");
  }
  return m_upper_tri_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_log_m(REF_DBL *m_upper_tri,
                                    REF_DBL *log_m_upper_tri) {
  REF_DBL d[12];

  RSS(ref_matrix_diag_m(m_upper_tri, d), "diag");

  d[0] = log(d[0]);
  d[1] = log(d[1]);
  d[2] = log(d[2]);

  RSS(ref_matrix_form_m(d, log_m_upper_tri), "form m");

  return REF_SUCCESS;
}